

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O1

void put_demapped_gray(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  JDIMENSION JVar1;
  JSAMPROW pJVar2;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *p_Var3;
  JSAMPROW pJVar4;
  ppm_dest_ptr dest;
  long lVar5;
  
  JVar1 = cinfo->output_width;
  if (JVar1 != 0) {
    pJVar2 = *cinfo->colormap;
    p_Var3 = dinfo[1].start_output;
    pJVar4 = *dinfo->buffer;
    lVar5 = 0;
    do {
      p_Var3[lVar5] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar2[pJVar4[lVar5]];
      lVar5 = lVar5 + 1;
    } while (JVar1 != (JDIMENSION)lVar5);
  }
  fwrite(dinfo[1].start_output,1,(size_t)dinfo[1].finish_output,(FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_demapped_gray(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                  JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
  register JSAMPROW color_map = cinfo->colormap[0];
  register JDIMENSION col;

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    PUTPPMSAMPLE(bufferptr, color_map[*ptr++]);
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}